

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentMap.cpp
# Opt level: O0

void __thiscall
EnvironmentMap::Reset
          (EnvironmentMap *this,shared_ptr<myvk::CommandPool> *command_pool,char *filename)

{
  undefined8 in_RDI;
  HdrImg HVar1;
  Ptr<ImageView> *unaff_retaddr;
  HdrImg *in_stack_00000008;
  DescriptorSet *in_stack_00000010;
  vector<double,_std::allocator<double>_> weights;
  HdrImg img;
  vector<double,_std::allocator<double>_> *in_stack_00000568;
  HdrImg *in_stack_00000570;
  shared_ptr<myvk::CommandPool> *in_stack_00000578;
  EnvironmentMap *in_stack_00000580;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffc0;
  undefined8 local_20;
  
  HVar1 = load_hdr_image(in_stack_ffffffffffffffc0);
  local_20 = HVar1.m_data;
  if (local_20 != (float *)0x0) {
    weigh_hdr_image(in_stack_00000008);
    create_images(in_stack_00000580,in_stack_00000578,in_stack_00000570,in_stack_00000568);
    free(local_20);
    std::__shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x1689c8);
    myvk::DescriptorSet::UpdateCombinedImageSampler
              (in_stack_00000010,(Ptr<Sampler> *)in_stack_00000008,unaff_retaddr,
               (uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI);
    std::__shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x1689f6);
    myvk::DescriptorSet::UpdateCombinedImageSampler
              (in_stack_00000010,(Ptr<Sampler> *)in_stack_00000008,unaff_retaddr,
               (uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

void EnvironmentMap::Reset(const std::shared_ptr<myvk::CommandPool> &command_pool, const char *filename) {
	HdrImg img = load_hdr_image(filename);
	if (!img.m_data)
		return;

	std::vector<double> weights = weigh_hdr_image(&img);
	create_images(command_pool, img, &weights);

	free(img.m_data); // release hdr image data

	m_descriptor_set->UpdateCombinedImageSampler(m_sampler, m_hdr_image_view, 0);
	m_descriptor_set->UpdateCombinedImageSampler(m_sampler, m_alias_table_image_view, 1);
}